

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void resizeline(Terminal *term,termline *line,wchar_t cols)

{
  wchar_t wVar1;
  undefined4 uVar2;
  termchar *ptVar3;
  wchar_t local_20;
  wchar_t oldcols;
  wchar_t i;
  wchar_t cols_local;
  termline *line_local;
  Terminal *term_local;
  
  if (line->cols != cols) {
    wVar1 = line->cols;
    for (local_20 = cols; local_20 < wVar1; local_20 = local_20 + L'\x01') {
      clear_cc(line,local_20);
    }
    if (cols < wVar1) {
      memmove(line->chars + cols,line->chars + wVar1,(long)(line->size - line->cols) << 5);
    }
    line->size = (cols - wVar1) + line->size;
    ptVar3 = (termchar *)saferealloc(line->chars,(long)line->size,0x20);
    line->chars = ptVar3;
    line->cols = cols;
    if (wVar1 < cols) {
      memmove(line->chars + cols,line->chars + wVar1,(long)(line->size - line->cols) << 5);
    }
    for (local_20 = L'\0'; local_20 < wVar1 && local_20 < cols; local_20 = local_20 + L'\x01') {
      if (line->chars[local_20].cc_next != L'\0') {
        line->chars[local_20].cc_next = (cols - wVar1) + line->chars[local_20].cc_next;
      }
    }
    local_20 = wVar1;
    if (line->cc_free != L'\0') {
      line->cc_free = (cols - wVar1) + line->cc_free;
    }
    for (; local_20 < cols; local_20 = local_20 + L'\x01') {
      ptVar3 = line->chars + local_20;
      ptVar3->chr = (term->basic_erase_char).chr;
      ptVar3->attr = (term->basic_erase_char).attr;
      ptVar3->truecolour = (term->basic_erase_char).truecolour;
      uVar2 = *(undefined4 *)&(term->basic_erase_char).field_0x1c;
      ptVar3->cc_next = (term->basic_erase_char).cc_next;
      *(undefined4 *)&ptVar3->field_0x1c = uVar2;
    }
  }
  return;
}

Assistant:

static void resizeline(Terminal *term, termline *line, int cols)
{
    int i, oldcols;

    if (line->cols != cols) {

        oldcols = line->cols;

        /*
         * This line is the wrong length, which probably means it
         * hasn't been accessed since a resize. Resize it now.
         *
         * First, go through all the characters that will be thrown
         * out in the resize (if we're shrinking the line) and
         * return their cc lists to the cc free list.
         */
        for (i = cols; i < oldcols; i++)
            clear_cc(line, i);

        /*
         * If we're shrinking the line, we now bodily move the
         * entire cc section from where it started to where it now
         * needs to be. (We have to do this before the resize, so
         * that the data we're copying is still there. However, if
         * we're expanding, we have to wait until _after_ the
         * resize so that the space we're copying into is there.)
         */
        if (cols < oldcols)
            memmove(line->chars + cols, line->chars + oldcols,
                    (line->size - line->cols) * TSIZE);

        /*
         * Now do the actual resize, leaving the _same_ amount of
         * cc space as there was to begin with.
         */
        line->size += cols - oldcols;
        line->chars = sresize(line->chars, line->size, TTYPE);
        line->cols = cols;

        /*
         * If we're expanding the line, _now_ we move the cc
         * section.
         */
        if (cols > oldcols)
            memmove(line->chars + cols, line->chars + oldcols,
                    (line->size - line->cols) * TSIZE);

        /*
         * Go through what's left of the original line, and adjust
         * the first cc_next pointer in each list. (All the
         * subsequent ones are still valid because they are
         * relative offsets within the cc block.) Also do the same
         * to the head of the cc_free list.
         */
        for (i = 0; i < oldcols && i < cols; i++)
            if (line->chars[i].cc_next)
                line->chars[i].cc_next += cols - oldcols;
        if (line->cc_free)
            line->cc_free += cols - oldcols;

        /*
         * And finally fill in the new space with erase chars. (We
         * don't have to worry about cc lists here, because we
         * _know_ the erase char doesn't have one.)
         */
        for (i = oldcols; i < cols; i++)
            line->chars[i] = term->basic_erase_char;

#ifdef TERM_CC_DIAGS
        cc_check(line);
#endif
    }
}